

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int irafncmp(char *irafheader,char *teststring,int nc)

{
  int iVar1;
  char *__s1;
  int in_EDX;
  char *in_RSI;
  char *line;
  undefined4 local_4;
  
  __s1 = iraf2str(in_RSI,in_EDX);
  if (__s1 == (char *)0x0) {
    local_4 = 1;
  }
  else {
    iVar1 = strncmp(__s1,in_RSI,(long)in_EDX);
    if (iVar1 == 0) {
      free(__s1);
      local_4 = 0;
    }
    else {
      free(__s1);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int irafncmp (

char	*irafheader,	/* IRAF image header from file */
char	*teststring,	/* C character string to compare */
int	nc)		/* Number of characters to compate */

{
    char *line;

    if ((line = iraf2str (irafheader, nc)) == NULL)
	return (1);
    if (strncmp (line, teststring, nc) == 0) {
	free (line);
	return (0);
	}
    else {
	free (line);
	return (1);
	}
}